

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O3

bool __thiscall
duckdb::CAggregateFunctionBindData::Equals(CAggregateFunctionBindData *this,FunctionData *other_p)

{
  CAggregateFunctionInfo *pCVar1;
  _func_int **pp_Var2;
  
  pCVar1 = this->info;
  pp_Var2 = other_p[1]._vptr_FunctionData;
  if (((pCVar1->extra_info == (duckdb_function_info)pp_Var2[7]) &&
      (pCVar1->update == (duckdb_aggregate_update_t)pp_Var2[3])) &&
     (pCVar1->combine == (duckdb_aggregate_combine_t)pp_Var2[4])) {
    return pCVar1->finalize == (duckdb_aggregate_finalize_t)pp_Var2[5];
  }
  return false;
}

Assistant:

bool Equals(const FunctionData &other_p) const override {
		auto &other = other_p.Cast<CAggregateFunctionBindData>();
		return info.extra_info == other.info.extra_info && info.update == other.info.update &&
		       info.combine == other.info.combine && info.finalize == other.info.finalize;
	}